

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header6.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::Header6::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Header6 *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"-PDU Header-\n");
  poVar1 = std::operator<<(poVar1,"Protocol Version: ");
  DATA_TYPE::ENUMS::GetEnumAsStringProtocolVersion_abi_cxx11_
            (&local_1c0,(ENUMS *)(ulong)this->m_ui8ProtocolVersion,Value);
  poVar1 = std::operator<<(poVar1,(string *)&local_1c0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Exercise ID:      ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(ushort)this->m_ui8ExerciseID);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"PDU Type:         ");
  DATA_TYPE::ENUMS::GetEnumAsStringPDUType_abi_cxx11_
            (&local_1e0,(ENUMS *)(ulong)this->m_ui8PDUType,Value_00);
  poVar1 = std::operator<<(poVar1,(string *)&local_1e0);
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"Protocol Family:  ");
  DATA_TYPE::ENUMS::GetEnumAsStringProtocolFamily_abi_cxx11_
            (&local_200,(ENUMS *)(ulong)this->m_ui8ProtocolFamily,Value_01);
  poVar1 = std::operator<<(poVar1,(string *)&local_200);
  poVar1 = std::operator<<(poVar1,"\n");
  DATA_TYPE::TimeStamp::GetAsString_abi_cxx11_(&local_220,&this->m_TimeStamp);
  poVar1 = std::operator<<(poVar1,(string *)&local_220);
  poVar1 = std::operator<<(poVar1,"PDU Length:       ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->m_ui16PDULength);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Header6::GetAsString() const
{
    KStringStream ss;

    ss << "-PDU Header-\n"
       << "Protocol Version: " << GetEnumAsStringProtocolVersion( m_ui8ProtocolVersion ) << "\n"
       << "Exercise ID:      " << ( KUINT16 )GetExerciseID()                             << "\n"
       << "PDU Type:         " << GetEnumAsStringPDUType( m_ui8PDUType )                 << "\n"
       << "Protocol Family:  " << GetEnumAsStringProtocolFamily( m_ui8ProtocolFamily )   << "\n"
       << m_TimeStamp.GetAsString()
       << "PDU Length:       " << m_ui16PDULength
       << "\n";

    return ss.str();
}